

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool Args::details::isMisspelledName(String *misspelled,String *correct)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  byte bVar1;
  string *in_RSI;
  string *in_RDI;
  String cs;
  String ms;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_58 [32];
  string local_38 [32];
  string *local_18;
  string *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    bVar1 = std::__cxx11::string::empty();
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::string(local_38,local_10);
      std::__cxx11::string::string(local_58,local_18);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::begin();
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::end();
      std::sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      __first._M_current = (char *)std::__cxx11::string::begin();
      __last._M_current = (char *)std::__cxx11::string::end();
      std::sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,__last);
      local_1 = std::operator==(__lhs,__rhs);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_38);
      goto LAB_00115f57;
    }
  }
  local_1 = 0;
LAB_00115f57:
  return (bool)(local_1 & 1);
}

Assistant:

static inline bool
isMisspelledName( const String & misspelled,
	const String & correct )
{
	if( !misspelled.empty() && !correct.empty() )
	{
		String ms = misspelled;
		String cs = correct;

		std::sort( ms.begin(), ms.end() );
		std::sort( cs.begin(), cs.end() );

		return ( ms == cs );
	}
	else
		return false;
}